

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O0

void __thiscall QSaveFile::cancelWriting(QSaveFile *this)

{
  long lVar1;
  bool bVar2;
  QSaveFilePrivate *s;
  long in_FS_OFFSET;
  QSaveFilePrivate *d;
  FileError in_stack_ffffffffffffff9c;
  QFileDevicePrivate *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = d_func((QSaveFile *)0x2f0d7a);
  bVar2 = QIODevice::isOpen((QIODevice *)in_stack_ffffffffffffffa0);
  if (bVar2) {
    tr((char *)s,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    QFileDevicePrivate::setError
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(QString *)0x2f0dcc);
    QString::~QString((QString *)0x2f0dd8);
    s->writeError = WriteError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSaveFile::cancelWriting()
{
    Q_D(QSaveFile);
    if (!isOpen())
        return;
    d->setError(QFileDevice::WriteError, QSaveFile::tr("Writing canceled by application"));
    d->writeError = QFileDevice::WriteError;
}